

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTruth.c
# Opt level: O1

word Hop_ManComputeTruth6(Hop_Man_t *p,Hop_Obj_t *pObj,int nVars)

{
  ulong uVar1;
  word wVar2;
  
  if ((*(uint *)&((Hop_Obj_t *)((ulong)pObj & 0xfffffffffffffffe))->field_0x20 & 7) == 1) {
    wVar2 = (ulong)((uint)pObj & 1) - 1;
  }
  else {
    if (0 < nVars) {
      uVar1 = 0;
      do {
        if ((long)p->vPis->nSize <= (long)uVar1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        *(int *)p->vPis->pArray[uVar1] = (int)uVar1;
        uVar1 = uVar1 + 1;
      } while ((uint)nVars != uVar1);
    }
    wVar2 = Hop_ManComputeTruth6_rec(p,(Hop_Obj_t *)((ulong)pObj & 0xfffffffffffffffe));
    wVar2 = -(ulong)((uint)pObj & 1) ^ wVar2;
  }
  return wVar2;
}

Assistant:

word Hop_ManComputeTruth6( Hop_Man_t * p, Hop_Obj_t * pObj, int nVars )
{
    word Truth;
    int i;
    if ( Hop_ObjIsConst1( Hop_Regular(pObj) ) )
        return Hop_IsComplement(pObj) ? 0 : ~(word)0;
    for ( i = 0; i < nVars; i++ )
        Hop_ManPi( p, i )->iData = i;
    Truth = Hop_ManComputeTruth6_rec( p, Hop_Regular(pObj) );
    return Hop_IsComplement(pObj) ? ~Truth : Truth;
}